

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenu::timerEvent(QMenu *this,QTimerEvent *e)

{
  TimerId TVar1;
  QMenuPrivate *this_00;
  QMenuScroller *pQVar2;
  QArrayData *pQVar3;
  long lVar4;
  
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  pQVar2 = this_00->scroll;
  if ((pQVar2 == (QMenuScroller *)0x0) || ((pQVar2->scrollTimer).m_id != *(TimerId *)(e + 0x10))) {
    TVar1 = *(TimerId *)(e + 0x10);
    if ((this_00->delayState).timer.m_id == TVar1) {
      if (this_00->currentAction != (QAction *)0x0) {
        QAction::menuObject();
        lVar4 = QMetaObject::cast((QObject *)&staticMetaObject);
        if (lVar4 == 0) {
          return;
        }
      }
      (this_00->delayState).action = (QAction *)0x0;
      QBasicTimer::stop();
      QBasicTimer::stop();
      internalDelayedPopup(this);
      return;
    }
    if ((this_00->sloppyState).m_time.m_id == TVar1) {
      QMenuSloppyState::timeout(&this_00->sloppyState);
      return;
    }
    if (((this_00->searchBufferTimer).m_id == TVar1) &&
       ((this_00->searchBuffer).d.ptr != (char16_t *)0x0)) {
      pQVar3 = &((this_00->searchBuffer).d.d)->super_QArrayData;
      (this_00->searchBuffer).d.d = (Data *)0x0;
      (this_00->searchBuffer).d.ptr = (char16_t *)0x0;
      (this_00->searchBuffer).d.size = 0;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
          return;
        }
      }
    }
  }
  else {
    QMenuPrivate::scrollMenu(this_00,(uint)pQVar2->scrollDirection,false,false);
    if (this_00->scroll->scrollFlags == '\0') {
      QBasicTimer::stop();
      return;
    }
  }
  return;
}

Assistant:

void
QMenu::timerEvent(QTimerEvent *e)
{
    Q_D(QMenu);
    if (d->scroll && d->scroll->scrollTimer.timerId() == e->timerId()) {
        d->scrollMenu((QMenuPrivate::QMenuScroller::ScrollDirection)d->scroll->scrollDirection);
        if (d->scroll->scrollFlags == QMenuPrivate::QMenuScroller::ScrollNone)
            d->scroll->scrollTimer.stop();
    } else if (d->delayState.timer.timerId() == e->timerId()) {
        if (d->currentAction && !d->currentAction->menu())
            return;
        d->delayState.stop();
        d->sloppyState.stopTimer();
        internalDelayedPopup();
    } else if (d->sloppyState.isTimerId(e->timerId())) {
        d->sloppyState.timeout();
    } else if (d->searchBufferTimer.timerId() == e->timerId()) {
        d->searchBuffer.clear();
    }
}